

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O2

void __thiscall CGL::RaytracedRenderer::visualize_accel(RaytracedRenderer *this)

{
  Color *pCVar1;
  BVHNode *pBVar2;
  pointer pLVar3;
  double dVar4;
  double dVar5;
  _Elt_pointer ppBVar6;
  Color *pCVar7;
  BVHAccel *pBVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001304 [12];
  Color CVar18;
  Color CVar19;
  Color CVar20;
  double local_b8;
  double dStack_a0;
  BVHNode *local_80;
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  tstack;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glLineWidth(0x3f800000);
  glEnable(0xb71);
  auVar11._8_4_ = 0x3f19999a;
  auVar11._0_8_ = 0x3f19999a3f19999a;
  auVar11._12_4_ = 0x3f19999a;
  vmovlps_avx(auVar11);
  auVar12._8_4_ = 0x3f4ccccd;
  auVar12._0_8_ = 0x3f4ccccd3f4ccccd;
  auVar12._12_4_ = 0x3f4ccccd;
  vmovlps_avx(auVar12);
  ppBVar6 = (this->selectionHistory).c.
            super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar6 ==
      (this->selectionHistory).c.
      super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar6 = (this->selectionHistory).c.
              super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pCVar1 = (Color *)ppBVar6[-1];
  glPolygonOffset(0x3f800000,0x3f800000);
  glEnable(0x8037);
  pBVar8 = this->bvh;
  pCVar7 = pCVar1;
  if (*(long *)&pCVar1[8].b != 0 || *(Color **)(pCVar1 + 8) != (Color *)0x0) {
    CGL::SceneObjects::BVHAccel::draw((BVHNode *)pBVar8,*(Color **)(pCVar1 + 8),1.0);
    pBVar8 = this->bvh;
    pCVar7 = *(Color **)&pCVar1[8].b;
  }
  CGL::SceneObjects::BVHAccel::draw((BVHNode *)pBVar8,pCVar7,1.0);
  glDisable(0x8037);
  CGL::SceneObjects::BVHAccel::drawOutline((BVHNode *)this->bvh,pCVar1,0.5);
  glDepthMask(0);
  std::
  stack<CGL::SceneObjects::BVHNode*,std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>>
  ::stack<std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>,void>
            (&tstack);
  local_80 = *(BVHNode **)(this->bvh + 0x48);
  std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>::
  emplace_back<CGL::SceneObjects::BVHNode*>
            ((deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>> *)
             &tstack,&local_80);
  while (tstack.c.
         super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         tstack.c.
         super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppBVar6 = tstack.c.
              super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (tstack.c.
        super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        tstack.c.
        super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar6 = tstack.c.
                super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pBVar2 = ppBVar6[-1];
    std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
    pop_back(&tstack.c);
    CVar18.b = 0.5;
    CVar18.r = 0.5;
    CVar18.g = 0.5;
    CGL::BBox::draw(CVar18,0.25);
    if (*(long *)(pBVar2 + 0x60) != 0) {
      std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
      push_back(&tstack.c,(value_type *)(pBVar2 + 0x60));
    }
    if (*(long *)(pBVar2 + 0x68) != 0) {
      std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
      push_back(&tstack.c,(value_type *)(pBVar2 + 0x68));
    }
  }
  lVar10._0_4_ = pCVar1[8].r;
  lVar10._4_4_ = pCVar1[8].g;
  if (lVar10 != 0) {
    CVar19.b = 1.0;
    CVar19.r = 1.0;
    CVar19.g = 1.0;
    CGL::BBox::draw(CVar19,0.6);
  }
  if (*(long *)&pCVar1[8].b != 0) {
    CVar20.b = 1.0;
    CVar20.r = 1.0;
    CVar20.g = 1.0;
    CGL::BBox::draw(CVar20,0.6);
  }
  glLineWidth(0x40400000);
  CGL::BBox::draw((Color)ZEXT812(0x3e8000003f800000),0.6);
  if (this->show_rays == true) {
    glLineWidth(0x3f800000);
    glBegin(1);
    lVar10 = 0;
    for (uVar9 = 0;
        pLVar3 = (this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)(((long)(this->rayLog).
                               super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pLVar3) / 0x50);
        uVar9 = uVar9 + 500) {
      local_b8 = *(double *)(pLVar3 + lVar10 + 0x40);
      if (0.0 <= local_b8) {
        glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
      }
      else {
        glColor4f(0x3f800000,0,0,0x3dcccccd);
        local_b8 = 100000.0;
      }
      pLVar3 = (this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar4 = *(double *)(pLVar3 + lVar10 + 0x20);
      dVar5 = *(double *)(pLVar3 + lVar10 + 0x20 + 8);
      auVar11 = *(undefined1 (*) [16])(pLVar3 + lVar10);
      auVar15._0_4_ = (float)*(double *)(pLVar3 + lVar10 + 8);
      auVar15._4_12_ = in_register_00001304;
      auVar13._0_4_ = (float)auVar11._0_8_;
      auVar13._4_12_ = auVar11._4_12_;
      glVertex3f(auVar13._0_8_,auVar15._0_8_,
                 CONCAT44((int)((ulong)*(double *)(pLVar3 + lVar10 + 0x10) >> 0x20),
                          (float)*(double *)(pLVar3 + lVar10 + 0x10)));
      dStack_a0 = auVar11._8_8_;
      auVar16._0_8_ = local_b8 * dVar4 + auVar11._0_8_;
      auVar16._8_8_ = local_b8 * dVar5 + dStack_a0;
      auVar14._0_4_ = (float)auVar16._0_8_;
      auVar14._4_12_ = auVar16._4_12_;
      auVar11 = vshufpd_avx(auVar16,auVar16,1);
      auVar17._0_4_ = (float)auVar11._0_8_;
      auVar17._4_12_ = auVar11._4_12_;
      glVertex3f(auVar14._0_8_,auVar17._0_8_);
      lVar10 = lVar10 + 40000;
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
  ~_Deque_base((_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                *)&tstack);
  return;
}

Assistant:

void RaytracedRenderer::visualize_accel() const {

  glPushAttrib(GL_ENABLE_BIT);
  glDisable(GL_LIGHTING);
  glLineWidth(1);
  glEnable(GL_DEPTH_TEST);

  // hardcoded color settings
  Color cnode = Color(.5, .5, .5); float cnode_alpha = 0.25f;
  Color cnode_hl = Color(1., .25, .0); float cnode_hl_alpha = 0.6f;
  Color cnode_hl_child = Color(1., 1., 1.); float cnode_hl_child_alpha = 0.6f;

  Color cprim_hl_left = Color(.6, .6, 1.); float cprim_hl_left_alpha = 1.f;
  Color cprim_hl_right = Color(.8, .8, 1.); float cprim_hl_right_alpha = 1.f;
  Color cprim_hl_edges = Color(0., 0., 0.); float cprim_hl_edges_alpha = 0.5f;

  BVHNode *selected = selectionHistory.top();

  // render solid geometry (with depth offset)
  glPolygonOffset(1.0, 1.0);
  glEnable(GL_POLYGON_OFFSET_FILL);

  if (selected->isLeaf()) {
    bvh->draw(selected, cprim_hl_left, cprim_hl_left_alpha);
  } else {
    bvh->draw(selected->l, cprim_hl_left, cprim_hl_left_alpha);
    bvh->draw(selected->r, cprim_hl_right, cprim_hl_right_alpha);
  }

  glDisable(GL_POLYGON_OFFSET_FILL);

  // draw geometry outline
  bvh->drawOutline(selected, cprim_hl_edges, cprim_hl_edges_alpha);

  // keep depth buffer check enabled so that mesh occluded bboxes, but
  // disable depth write so that bboxes don't occlude each other.
  glDepthMask(GL_FALSE);

  // create traversal stack
  stack<BVHNode *> tstack;

  // push initial traversal data
  tstack.push(bvh->get_root());

  // draw all BVH bboxes with non-highlighted color
  while (!tstack.empty()) {

    BVHNode *current = tstack.top();
    tstack.pop();

    current->bb.draw(cnode, cnode_alpha);
    if (current->l) tstack.push(current->l);
    if (current->r) tstack.push(current->r);
  }

  // draw selected node bbox and primitives
  if (selected->l) selected->l->bb.draw(cnode_hl_child, cnode_hl_child_alpha);
  if (selected->r) selected->r->bb.draw(cnode_hl_child, cnode_hl_child_alpha);

  glLineWidth(3.f);
  selected->bb.draw(cnode_hl, cnode_hl_alpha);

  // now perform visualization of the rays
  if (show_rays) {
      glLineWidth(1.f);
      glBegin(GL_LINES);

      for (size_t i=0; i<rayLog.size(); i+=500) {

          const static double VERY_LONG = 10e4;
          double ray_t = VERY_LONG;

          // color rays that are hits yellow
          // and rays this miss all geometry red
          if (rayLog[i].hit_t >= 0.0) {
              ray_t = rayLog[i].hit_t;
              glColor4f(1.f, 1.f, 0.f, 0.1f);
          } else {
              glColor4f(1.f, 0.f, 0.f, 0.1f);
          }

          Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

          glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
          glVertex3f(end[0], end[1], end[2]);
      }
      glEnd();
  }

  glDepthMask(GL_TRUE);
  glPopAttrib();
}